

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten.cpp
# Opt level: O2

int __thiscall ncnn::Flatten::forward(Flatten *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  Mat local_70;
  
  uVar7 = (long)bottom_blob->h * (long)bottom_blob->w;
  uVar1 = bottom_blob->c;
  Mat::create(top_blob,(int)uVar7 * uVar1,bottom_blob->elemsize,opt->blob_allocator);
  iVar4 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    uVar6 = 0;
    if (0 < (int)uVar7) {
      uVar6 = uVar7 & 0xffffffff;
    }
    uVar9 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar9 = 0;
    }
    lVar10 = 0;
    for (uVar8 = 0; uVar8 != uVar9; uVar8 = uVar8 + 1) {
      Mat::channel(&local_70,bottom_blob,(int)uVar8);
      pvVar3 = local_70.data;
      Mat::~Mat(&local_70);
      pvVar2 = top_blob->data;
      for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        *(undefined4 *)((long)pvVar2 + uVar5 * 4 + lVar10) =
             *(undefined4 *)((long)pvVar3 + uVar5 * 4);
      }
      lVar10 = lVar10 + uVar7 * 4;
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int Flatten::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(size * channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);
        float* outptr = (float*)top_blob + size * q;

        for (int i=0; i<size; i++)
        {
            outptr[i] = ptr[i];
        }
    }

    return 0;
}